

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Filters.cpp
# Opt level: O0

CloningFilter *
helics::make_cloning_filter(FilterTypes type,Federate *mFed,string_view delivery,string_view name)

{
  string_view endpoint;
  bool bVar1;
  __shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2> *this;
  char *in_RCX;
  size_t in_RDX;
  Federate *in_RSI;
  undefined4 in_EDI;
  Federate *unaff_retaddr;
  undefined1 in_stack_00000008 [16];
  undefined1 in_stack_00000018 [16];
  string_view in_stack_00000030;
  CloningFilter *dfilt;
  Core *in_stack_000000c0;
  FilterTypes in_stack_000000cc;
  Filter *in_stack_000000d0;
  undefined4 in_stack_ffffffffffffff80;
  basic_string_view<char,_std::char_traits<char>_> local_68;
  basic_string_view<char,_std::char_traits<char>_> local_58 [2];
  CloningFilter *local_38;
  Federate *local_30;
  undefined4 local_24;
  basic_string_view<char,_std::char_traits<char>_> local_10;
  
  local_30 = in_RSI;
  local_24 = in_EDI;
  local_10._M_len = in_RDX;
  local_10._M_str = in_RCX;
  CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(local_58);
  CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_68);
  local_38 = Federate::registerCloningFilter
                       (unaff_retaddr,(string_view)in_stack_00000018,(string_view)in_stack_00000008,
                        in_stack_00000030);
  this = (__shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2> *)
         Federate::getCorePointer(local_30);
  std::__shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>::get(this);
  addOperations(in_stack_000000d0,in_stack_000000cc,in_stack_000000c0);
  bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty(&local_10);
  if (!bVar1) {
    endpoint._M_str = local_10._M_str;
    endpoint._M_len = local_10._M_len;
    CloningFilter::addDeliveryEndpoint
              ((CloningFilter *)CONCAT44(local_24,in_stack_ffffffffffffff80),endpoint);
  }
  return local_38;
}

Assistant:

CloningFilter& make_cloning_filter(FilterTypes type,
                                   Federate* mFed,
                                   std::string_view delivery,
                                   std::string_view name)
{
    auto& dfilt = mFed->registerCloningFilter(name);
    addOperations(&dfilt, type, mFed->getCorePointer().get());
    if (!delivery.empty()) {
        dfilt.addDeliveryEndpoint(delivery);
    }
    return dfilt;
}